

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Client::~Client(Client *this)

{
  Worker *this_00;
  
  this->_vptr_Client = (_func_int **)&PTR__Client_0014e8e8;
  this_00 = (this->worker_)._M_t.
            super___uniq_ptr_impl<restincurl::Worker,_std::default_delete<restincurl::Worker>_>._M_t
            .super__Tuple_impl<0UL,_restincurl::Worker_*,_std::default_delete<restincurl::Worker>_>.
            super__Head_base<0UL,_restincurl::Worker_*,_false>._M_head_impl;
  if (this_00 != (Worker *)0x0) {
    Worker::Close(this_00);
  }
  std::unique_ptr<restincurl::Worker,_std::default_delete<restincurl::Worker>_>::~unique_ptr
            (&this->worker_);
  return;
}

Assistant:

virtual ~Client() {
#if RESTINCURL_ENABLE_ASYNC
            if (worker_) {
                try {
                    worker_->Close();
                } catch (const std::exception& ex) {
                    RESTINCURL_LOG("~Client(): " << ex.what());
                }
            }
#endif
        }